

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::sendPendingMoveAndResizeEvents
          (QWidgetPrivate *this,bool recursive,bool disableUpdates)

{
  uint uVar1;
  QObject *pQVar2;
  QWidgetPrivate *d;
  long lVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  long in_FS_OFFSET;
  bool disableUpdates_00;
  QSize local_68;
  QSize local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QObject **)&this->field_0x8;
  if ((int)CONCAT71(in_register_00000011,disableUpdates) == 0) {
    disableUpdates_00 = false;
  }
  else {
    disableUpdates_00 = (*(byte *)(*(long *)(pQVar2 + 0x20) + 9) & 4) == 0;
  }
  if (disableUpdates_00 != false) {
    uVar1 = *(uint *)(*(long *)(pQVar2 + 0x20) + 8);
    if ((uVar1 >> 10 & 1) == 0) {
      *(uint *)(*(long *)(pQVar2 + 0x20) + 8) = uVar1 | 0x400;
    }
  }
  if ((*(byte *)(*(long *)(pQVar2 + 8) + 0x240) & 4) != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.wd.m_i = (this->data).crect.x1.m_i;
    local_68.ht.m_i = (this->data).crect.y1.m_i;
    local_60 = local_68;
    QMoveEvent::QMoveEvent((QMoveEvent *)&local_58,(QPoint *)&local_60,(QPoint *)&local_68);
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_58);
    uVar1 = *(uint *)(*(long *)(pQVar2 + 8) + 0x240);
    if ((uVar1 & 4) != 0) {
      *(uint *)(*(long *)(pQVar2 + 8) + 0x240) = uVar1 & 0xfffffffb;
    }
    QMoveEvent::~QMoveEvent((QMoveEvent *)&local_58);
  }
  if ((*(byte *)(*(long *)(pQVar2 + 8) + 0x240) & 8) != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_60.wd.m_i = ((this->data).crect.x2.m_i - (this->data).crect.x1.m_i) + 1;
    local_60.ht.m_i = ((this->data).crect.y2.m_i - (this->data).crect.y1.m_i) + 1;
    local_68.wd.m_i = -1;
    local_68.ht.m_i = -1;
    QResizeEvent::QResizeEvent((QResizeEvent *)&local_58,&local_60,&local_68);
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_58);
    uVar1 = *(uint *)(*(long *)(pQVar2 + 8) + 0x240);
    if ((uVar1 & 8) != 0) {
      *(uint *)(*(long *)(pQVar2 + 8) + 0x240) = uVar1 & 0xfffffff7;
    }
    QResizeEvent::~QResizeEvent((QResizeEvent *)&local_58);
  }
  if (disableUpdates_00 != false) {
    uVar1 = *(uint *)(*(long *)(pQVar2 + 0x20) + 8);
    if ((uVar1 >> 10 & 1) != 0) {
      *(uint *)(*(long *)(pQVar2 + 0x20) + 8) = uVar1 & 0xfffffbff;
    }
  }
  if ((recursive) && (*(long *)&this->field_0x28 != 0)) {
    uVar4 = 0;
    do {
      lVar3 = *(long *)(*(long *)&this->field_0x20 + uVar4 * 8);
      if ((lVar3 == 0) || ((*(byte *)(*(long *)(lVar3 + 8) + 0x30) & 1) == 0)) {
        lVar3 = 0;
      }
      if (lVar3 != 0) {
        sendPendingMoveAndResizeEvents(*(QWidgetPrivate **)(lVar3 + 8),true,disableUpdates_00);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < *(ulong *)&this->field_0x28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::sendPendingMoveAndResizeEvents(bool recursive, bool disableUpdates)
{
    Q_Q(QWidget);

    disableUpdates = disableUpdates && q->updatesEnabled();
    if (disableUpdates)
        q->setAttribute(Qt::WA_UpdatesDisabled);

    if (q->testAttribute(Qt::WA_PendingMoveEvent)) {
        QMoveEvent e(data.crect.topLeft(), data.crect.topLeft());
        QCoreApplication::sendEvent(q, &e);
        q->setAttribute(Qt::WA_PendingMoveEvent, false);
    }

    if (q->testAttribute(Qt::WA_PendingResizeEvent)) {
        QResizeEvent e(data.crect.size(), QSize());
        QCoreApplication::sendEvent(q, &e);
        q->setAttribute(Qt::WA_PendingResizeEvent, false);
    }

    if (disableUpdates)
        q->setAttribute(Qt::WA_UpdatesDisabled, false);

    if (!recursive)
        return;

    for (int i = 0; i < children.size(); ++i) {
        if (QWidget *child = qobject_cast<QWidget *>(children.at(i)))
            child->d_func()->sendPendingMoveAndResizeEvents(recursive, disableUpdates);
    }
}